

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chr_time.c
# Opt level: O0

void chr_timer_stop(chr_time *time)

{
  chr_time *in_RDI;
  timeval duration;
  timeval now;
  undefined1 local_28 [16];
  chr_time local_18;
  
  local_18.d3 = (double)in_RDI;
  gettimeofday((timeval *)(local_28 + 0x10),(__timezone_ptr_t)0x0);
  chr_timer_diff((chr_time *)local_28,(chr_time *)(local_28 + 0x10),(chr_time *)local_18.d3);
  *(double *)local_18.d3 = (double)local_28._0_8_;
  *(undefined8 *)((long)local_18.d3 + 8) = local_28._8_8_;
  return;
}

Assistant:

extern void
chr_timer_stop( chr_time *time)
{
    struct timeval now;
    struct timeval duration;

#ifndef HAVE_WINDOWS_H
    gettimeofday((struct timeval*)&now, NULL);
#else
    /* GSE...  No gettimeofday on windows.
     * Must use _ftime, get millisec time, convert to usec.  Bleh.
     */
    struct _timeb nowb;
    _ftime(&nowb);
    ((struct timeval*)&now)->tv_sec = (long)nowb.time;
    ((struct timeval*)&now)->tv_usec = nowb.millitm * 1000;
#endif
//    gettimeofday(&now, NULL);
    chr_timer_diff((chr_time*)&duration, (chr_time*)&now, time);
    *((struct timeval *) time) = duration;
}